

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

int lookup_uniforms(MOJOSHADER_glProgram *program,MOJOSHADER_glShader *shader,int *bound)

{
  MOJOSHADER_uniform *pMVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  MOJOSHADER_uniformType MVar7;
  MOJOSHADER_parseData *pMVar8;
  _func_int *p_Var9;
  MOJOSHADER_constant *pMVar10;
  _func_void_MOJOSHADER_glProgram_ptr *p_Var11;
  _func_void_MOJOSHADER_glProgram_ptr_MOJOSHADER_uniform_ptr_GLfloat_ptr *p_Var12;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *p_Var13;
  UniformMap *pUVar14;
  undefined8 uVar15;
  MOJOSHADER_glShader *pMVar16;
  MOJOSHADER_glProgram *pMVar17;
  int iVar18;
  GLint GVar19;
  ulong uVar20;
  GLfloat *__s;
  GLint *pGVar21;
  ulong uVar22;
  GLfloat **ppGVar23;
  GLint **ppGVar24;
  long lVar25;
  size_t *psVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  size_t sVar30;
  uint uVar31;
  GLfloat *pGVar32;
  undefined1 auStack_68 [8];
  MOJOSHADER_glShader *local_60;
  int *local_58;
  uint local_4c;
  ulong local_48;
  uint local_40;
  uint local_3c;
  MOJOSHADER_glProgram *local_38;
  
  pGVar32 = (GLfloat *)auStack_68;
  local_58 = bound;
  local_60 = shader;
  pMVar8 = shader->parseData;
  local_48 = (ulong)pMVar8->shader_type;
  local_3c = 0;
  local_40 = 0;
  uVar31 = 0;
  local_38 = program;
  for (lVar29 = 0; pMVar16 = local_60, lVar29 < pMVar8->uniform_count; lVar29 = lVar29 + 1) {
    pMVar1 = pMVar8->uniforms + lVar29;
    if (pMVar8->uniforms[lVar29].constant == 0) {
      p_Var13 = ctx->profileGetUniformLocation;
      *(undefined8 *)((long)pGVar32 + -8) = 0x10a73c;
      GVar19 = (*p_Var13)(program,pMVar16,(int)lVar29);
      if (GVar19 != -1) {
        iVar18 = pMVar1->array_count;
        pUVar14 = program->uniforms;
        uVar6 = program->uniform_count;
        pUVar14[uVar6].shader_type = (MOJOSHADER_shaderType)local_48;
        pUVar14[uVar6].uniform = pMVar1;
        pUVar14[uVar6].location = GVar19;
        program->uniform_count = uVar6 + 1;
        MVar7 = pMVar1->type;
        if (MVar7 == MOJOSHADER_UNIFORM_BOOL) {
          local_3c = local_3c + iVar18 + (uint)(iVar18 == 0);
        }
        else if (MVar7 == MOJOSHADER_UNIFORM_INT) {
          local_40 = local_40 + iVar18 + (uint)(iVar18 == 0);
        }
        else {
          if (MVar7 != MOJOSHADER_UNIFORM_FLOAT) {
            *(undefined8 *)((long)pGVar32 + -8) = 0x10a95a;
            __assert_fail("0 && \"Unexpected register type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x6a7,
                          "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                         );
          }
          uVar31 = uVar31 + iVar18 + (uint)(iVar18 == 0);
        }
      }
    }
    else {
      p_Var9 = ctx->profileMustPushConstantArrays;
      *(undefined8 *)((long)pGVar32 + -8) = 0x10a66c;
      iVar18 = (*p_Var9)();
      if (iVar18 != 0) {
        local_4c = uVar31;
        iVar18 = pMVar1->index;
        iVar3 = pMVar1->array_count;
        pGVar32 = (GLfloat *)((long)pGVar32 + (long)iVar3 * -0x10);
        iVar4 = pMVar8->constant_count;
        pGVar32[-2] = 1.12104e-44;
        pGVar32[-1] = 0.0;
        lVar27 = *(long *)(pGVar32 + -2);
        iVar28 = 0;
        for (lVar25 = 0; pMVar17 = local_38, lVar25 < iVar4; lVar25 = lVar25 + 1) {
          pMVar10 = pMVar8->constants;
          if (*(int *)((long)pMVar10 + lVar27 + -8) == 0) {
            iVar5 = *(int *)((long)pMVar10 + lVar27 + -4);
            if ((iVar18 <= iVar5) && (iVar5 < iVar3 + iVar18)) {
              puVar2 = (undefined8 *)((long)&pMVar10->type + lVar27);
              uVar15 = puVar2[1];
              *(undefined8 *)(pGVar32 + (iVar5 - iVar18) * 4) = *puVar2;
              *(undefined8 *)(pGVar32 + (iVar5 - iVar18) * 4 + 2) = uVar15;
              iVar28 = iVar28 + 1;
            }
          }
          lVar27 = lVar27 + 0x18;
        }
        if (iVar28 != iVar3) {
          pGVar32[-2] = 1.530076e-39;
          pGVar32[-1] = 0.0;
          __assert_fail("filled == size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x670,
                        "void fill_constant_array(GLfloat *, const int, const int, const MOJOSHADER_parseData *)"
                       );
        }
        if (*local_58 == 0) {
          p_Var11 = ctx->profileUseProgram;
          pGVar32[-2] = 1.529279e-39;
          pGVar32[-1] = 0.0;
          (*p_Var11)(pMVar17);
          *local_58 = 1;
        }
        program = local_38;
        p_Var12 = ctx->profilePushConstantArray;
        pGVar32[-2] = 1.52933e-39;
        pGVar32[-1] = 0.0;
        (*p_Var12)(program,pMVar1,pGVar32);
        uVar31 = local_4c;
      }
    }
  }
  iVar18 = (int)local_48;
  if (iVar18 == 1) {
    uVar20 = 0;
    uVar22 = (ulong)(uint)pMVar8->sampler_count;
    if (pMVar8->sampler_count < 1) {
      uVar22 = uVar20;
    }
    for (; uVar22 * 0x18 - uVar20 != 0; uVar20 = uVar20 + 0x18) {
      if (*(int *)((long)&pMVar8->samplers->texbem + uVar20) != 0) {
        uVar31 = uVar31 + 2;
        program->texbem_count = program->texbem_count + 1;
      }
    }
  }
  if (uVar31 != 0) {
    sVar30 = (ulong)uVar31 << 4;
    *(undefined8 *)((long)pGVar32 + -8) = 0x10a7e8;
    __s = (GLfloat *)Malloc(sVar30);
    if (__s == (GLfloat *)0x0) {
      return 0;
    }
    if (1 < iVar18 - 1U) {
      *(undefined8 *)((long)pGVar32 + -8) = 0x10a979;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6ca,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar23 = &local_38->ps_uniforms_float4;
    if (iVar18 == 2) {
      ppGVar23 = &local_38->vs_uniforms_float4;
    }
    *ppGVar23 = __s;
    psVar26 = &local_38->vs_uniforms_float4_count;
    if (iVar18 != 2) {
      psVar26 = &local_38->ps_uniforms_float4_count;
    }
    *psVar26 = (ulong)uVar31;
    *(undefined8 *)((long)pGVar32 + -8) = 0x10a832;
    memset(__s,0,sVar30);
  }
  if (local_40 != 0) {
    uVar22 = (ulong)local_40;
    sVar30 = uVar22 << 4;
    *(undefined8 *)((long)pGVar32 + -8) = 0x10a84b;
    pGVar21 = (GLint *)Malloc(sVar30);
    if (pGVar21 == (GLint *)0x0) {
      return 0;
    }
    if (1 < iVar18 - 1U) {
      *(undefined8 *)((long)pGVar32 + -8) = 0x10a998;
      __assert_fail("0 && \"unsupported shader type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x6cb,
                    "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
    }
    ppGVar24 = &local_38->ps_uniforms_int4;
    if (iVar18 == 2) {
      ppGVar24 = &local_38->vs_uniforms_int4;
    }
    *ppGVar24 = pGVar21;
    psVar26 = &local_38->vs_uniforms_int4_count;
    if (iVar18 != 2) {
      psVar26 = &local_38->ps_uniforms_int4_count;
    }
    *psVar26 = uVar22;
    *(undefined8 *)((long)pGVar32 + -8) = 0x10a898;
    memset(pGVar21,0,sVar30);
  }
  *(undefined8 *)((long)pGVar32 + -8) = 1;
  uVar15 = *(undefined8 *)((long)pGVar32 + -8);
  if (local_3c == 0) {
    return (int)uVar15;
  }
  uVar22 = (ulong)local_3c;
  sVar30 = uVar22 * 4;
  *(undefined8 *)((long)pGVar32 + -8) = 0x10a8b6;
  pGVar21 = (GLint *)Malloc(sVar30);
  if (pGVar21 == (GLint *)0x0) {
    return 0;
  }
  iVar18 = (int)local_48;
  if (1 < iVar18 - 1U) {
    *(code **)((long)pGVar32 + -8) = lookup_samplers;
    __assert_fail("0 && \"unsupported shader type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x6cc,"int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                 );
  }
  ppGVar24 = &local_38->ps_uniforms_bool;
  if (iVar18 == 2) {
    ppGVar24 = &local_38->vs_uniforms_bool;
  }
  *ppGVar24 = pGVar21;
  psVar26 = &local_38->vs_uniforms_bool_count;
  if (iVar18 != 2) {
    psVar26 = &local_38->ps_uniforms_bool_count;
  }
  *psVar26 = uVar22;
  *(undefined8 *)((long)pGVar32 + -8) = 0x10a905;
  memset(pGVar21,0,sVar30);
  return (int)uVar15;
}

Assistant:

static int lookup_uniforms(MOJOSHADER_glProgram *program,
                           MOJOSHADER_glShader *shader, int *bound)
{
    const MOJOSHADER_parseData *pd = shader->parseData;
    const MOJOSHADER_shaderType shader_type = pd->shader_type;
    uint32 float4_count = 0;
    uint32 int4_count = 0;
    uint32 bool_count = 0;
    int i;

    for (i = 0; i < pd->uniform_count; i++)
    {
        const MOJOSHADER_uniform *u = &pd->uniforms[i];

        if (u->constant)
        {
            // only do constants once, at link time. These aren't changed ever.
            if (ctx->profileMustPushConstantArrays())
            {
                const int base = u->index;
                const int size = u->array_count;
                GLfloat *f = (GLfloat *) alloca(sizeof (GLfloat) * (size * 4));
                fill_constant_array(f, base, size, pd);
                if (!(*bound))
                {
                    ctx->profileUseProgram(program);
                    *bound = 1;
                } // if
                ctx->profilePushConstantArray(program, u, f);
            } // if
        } // if

        else
        {
            const GLint loc = ctx->profileGetUniformLocation(program, shader, i);
            if (loc != -1)  // -1 means it was optimized out, or failure.
            {
                const int regcount = u->array_count;
                UniformMap *map = &program->uniforms[program->uniform_count];
                map->shader_type = shader_type;
                map->uniform = u;
                map->location = (GLuint) loc;
                program->uniform_count++;

                if (u->type == MOJOSHADER_UNIFORM_FLOAT)
                    float4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_INT)
                    int4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_BOOL)
                    bool_count += regcount ? regcount : 1;
                else
                    assert(0 && "Unexpected register type");
            } // if
        } // else
    } // for

    if (shader_type == MOJOSHADER_TYPE_PIXEL)
    {
        for (i = 0; i < pd->sampler_count; i++)
        {
            if (pd->samplers[i].texbem)
            {
                float4_count += 2;
                program->texbem_count++;
            } // if
        } // for
    } // if

    #define MAKE_ARRAY(typ, gltyp, siz, count) \
        if (count) { \
            const size_t buflen = sizeof (gltyp) * siz * count; \
            gltyp *ptr = (gltyp *) Malloc(buflen); \
            if (ptr == NULL) { \
                return 0; \
            } else if (shader_type == MOJOSHADER_TYPE_VERTEX) { \
                program->vs_uniforms_##typ = ptr; \
                program->vs_uniforms_##typ##_count = count; \
            } else if (shader_type == MOJOSHADER_TYPE_PIXEL) { \
                program->ps_uniforms_##typ = ptr; \
                program->ps_uniforms_##typ##_count = count; \
            } else { \
                assert(0 && "unsupported shader type"); \
            } \
            memset(ptr, '\0', buflen); \
        }

    MAKE_ARRAY(float4, GLfloat, 4, float4_count);
    MAKE_ARRAY(int4, GLint, 4, int4_count);
    MAKE_ARRAY(bool, GLint, 1, bool_count);

    #undef MAKE_ARRAY

    return 1;
}